

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void ra_append_copies_after
               (roaring_array_t *ra,roaring_array_t *sa,uint16_t before_start,_Bool copy_on_write)

{
  int32_t iVar1;
  int32_t local_20;
  int start_location;
  _Bool copy_on_write_local;
  uint16_t before_start_local;
  roaring_array_t *sa_local;
  roaring_array_t *ra_local;
  
  iVar1 = ra_get_index(sa,before_start);
  if (iVar1 < 0) {
    local_20 = -1 - iVar1;
  }
  else {
    local_20 = iVar1 + 1;
  }
  ra_append_copy_range(ra,sa,local_20,sa->size,copy_on_write);
  return;
}

Assistant:

void ra_append_copies_after(roaring_array_t *ra, const roaring_array_t *sa,
                            uint16_t before_start, bool copy_on_write) {
    int start_location = ra_get_index(sa, before_start);
    if (start_location >= 0)
        ++start_location;
    else
        start_location = -start_location - 1;
    ra_append_copy_range(ra, sa, start_location, sa->size, copy_on_write);
}